

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareSin2Distances<double>
              (Vector3<double> *x,Vector3<double> *a,Vector3<double> *b)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double sin2_bx_error;
  double sin2_ax_error;
  
  dVar2 = GetSin2Distance(a,x,&sin2_ax_error);
  dVar3 = GetSin2Distance(b,x,&sin2_bx_error);
  iVar1 = 1;
  if (dVar2 - dVar3 <= sin2_ax_error + sin2_bx_error) {
    iVar1 = -(uint)(dVar2 - dVar3 < -(sin2_ax_error + sin2_bx_error));
  }
  return iVar1;
}

Assistant:

int TriageCompareSin2Distances(const Vector3<T>& x,
                               const Vector3<T>& a, const Vector3<T>& b) {
  T sin2_ax_error, sin2_bx_error;
  T sin2_ax = GetSin2Distance(a, x, &sin2_ax_error);
  T sin2_bx = GetSin2Distance(b, x, &sin2_bx_error);
  T diff = sin2_ax - sin2_bx;
  T error = sin2_ax_error + sin2_bx_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}